

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O2

void __thiscall value_precede::value_precede(value_precede *this,int _s,int _t,vec<IntVar_*> *vs)

{
  vec<IntVar_*> *this_00;
  int iVar1;
  int iVar2;
  IntVar *pIVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint ii;
  ulong uVar8;
  long lVar9;
  IntVar *x;
  int local_4c;
  Tchar *local_48;
  Tint *local_40;
  Tint *local_38;
  
  Propagator::Propagator(&this->super_Propagator);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__value_precede_001f0cc8;
  *(int *)&(this->super_Propagator).field_0x14 = _s;
  this->t = _t;
  this_00 = &this->xs;
  (this->xs).sz = 0;
  (this->xs).cap = 0;
  (this->xs).data = (IntVar **)0x0;
  local_40 = &this->second_s;
  local_38 = &this->first_t;
  local_48 = &this->satisfied;
  (this->satisfied).v = '\0';
  for (uVar7 = 0; uVar7 < vs->sz; uVar7 = uVar7 + 1) {
    bVar4 = IntVar::indomain(vs->data[uVar7],(long)this->t);
    if (bVar4) {
      int_rel(vs->data[uVar7],IRT_NE,this->t);
    }
    bVar4 = IntVar::indomain(vs->data[uVar7],(long)*(int *)&(this->super_Propagator).field_0x14);
    if (bVar4) break;
  }
  Tint::operator=(&this->first_s,0);
  iVar5 = -1;
  for (; uVar7 < vs->sz; uVar7 = uVar7 + 1) {
    x = vs->data[uVar7];
    iVar1 = (x->min).v;
    iVar2 = *(int *)&(this->super_Propagator).field_0x14;
    if (iVar1 == iVar2 && (x->max).v == iVar1) break;
    bVar4 = IntVar::indomain(x,(long)iVar2);
    if (bVar4) {
LAB_0015a790:
      vec<IntVar_*>::push(this_00,&x);
      iVar1 = (x->min).v;
      if ((iVar1 == (x->max).v) && (iVar1 == this->t)) goto LAB_0015a7b5;
    }
    else {
      bVar4 = IntVar::indomain(x,(long)this->t);
      if (bVar4) goto LAB_0015a790;
    }
  }
  iVar5 = 0;
LAB_0015a7b5:
  uVar6 = this_00->sz;
  if (uVar6 < 2) {
    Tchar::operator=(local_48,'\x01');
  }
  else {
    uVar7 = 0;
    local_4c = iVar5;
    for (uVar8 = 0; uVar8 < uVar6; uVar8 = uVar8 + 1) {
      pIVar3 = *(IntVar **)((long)(this->xs).data + uVar7 * 4);
      IntVar::specialiseToEL(pIVar3);
      bVar4 = IntVar::indomain(pIVar3,(long)*(int *)&(this->super_Propagator).field_0x14);
      if (bVar4) {
        (*(pIVar3->super_Var).super_Branching._vptr_Branching[7])(pIVar3,this,uVar7 & 0xffffffff,1);
      }
      bVar4 = IntVar::indomain(pIVar3,(long)this->t);
      if (bVar4) {
        (*(pIVar3->super_Var).super_Branching._vptr_Branching[7])
                  (pIVar3,this,(ulong)((int)uVar7 + 1),8);
      }
      uVar6 = this_00->sz;
      uVar7 = uVar7 + 2;
    }
    Tint::operator=(local_38,uVar6 + local_4c);
    for (lVar9 = 1; lVar9 < (int)this_00->sz; lVar9 = lVar9 + 1) {
      bVar4 = IntVar::indomain((this->xs).data[lVar9],
                               (long)*(int *)&(this->super_Propagator).field_0x14);
      if (bVar4) break;
    }
    Tint::operator=(local_40,(int)lVar9);
    if (local_38->v <= local_40->v) {
      pIVar3 = (this->xs).data[(uint)(this->first_s).v];
      iVar5 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0x10])
                        (pIVar3,(long)*(int *)&(this->super_Propagator).field_0x14,0,1);
      if ((char)iVar5 == '\0') {
        puts("=====UNSATISFIABLE=====");
        printf("%% Top level failure!\n");
        exit(0);
      }
      Tchar::operator=(local_48,'\x01');
    }
  }
  return;
}

Assistant:

value_precede(int _s, int _t, vec<IntVar*>& vs) : s(_s), t(_t), satisfied(0) {
		// Find the first possible occurrence of s.
		unsigned int ii = 0;
		// Can't do remVal before initialization.
		for (; ii < vs.size(); ii++) {
			if (vs[ii]->indomain(t)) {
				int_rel(vs[ii], IRT_NE, t);
			}
			if (vs[ii]->indomain(s)) {
				break;
			}
		}

		// Now copy the remaining values.
		bool t_seen = false;
		first_s = 0;
		for (; ii < vs.size(); ii++) {
			IntVar* x(vs[ii]);
			if (x->isFixed() && x->getVal() == s) {
				break;
			}

			if (!x->indomain(s) && !x->indomain(t)) {
				continue;
			}
			xs.push(x);

			if (x->isFixed() && x->getVal() == t) {
				t_seen = true;
				break;
			}
		}

		if (xs.size() <= 1) {
			satisfied = 1;
			return;
		}

		for (unsigned int ii = 0; ii < xs.size(); ii++) {
			IntVar* x(xs[ii]);
			x->specialiseToEL();
			if (x->indomain(s)) {
				x->attach(this, ii << 1, EVENT_C);
			}
			if (x->indomain(t)) {
				x->attach(this, (ii << 1) | 1, EVENT_F);
			}
		}

		first_t = xs.size() - static_cast<int>(t_seen);

		int si = 1;
		for (; si < static_cast<int>(xs.size()); ++si) {
			if (xs[si]->indomain(s)) {
				break;
			}
		}
		second_s = si;
		if (first_t <= second_s) {
			if (!xs[first_s]->setVal(s)) {
				TL_FAIL();
			}
			satisfied = 1;
		}
	}